

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streams_tests.cpp
# Opt level: O2

void __thiscall streams_tests::streams_buffered_file::test_method(streams_buffered_file *this)

{
  long lVar1;
  bool bVar2;
  byte bVar3;
  ulong uVar4;
  uint8_t j;
  long lVar5;
  uint8_t obj;
  FILE *__stream;
  iterator in_R8;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  uint8_t *puVar8;
  uint8_t *puVar9;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  const_string file_07;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string file_19;
  const_string file_20;
  const_string file_21;
  const_string file_22;
  const_string file_23;
  const_string file_24;
  const_string file_25;
  const_string file_26;
  const_string file_27;
  const_string file_28;
  const_string file_29;
  const_string file_30;
  const_string file_31;
  const_string file_32;
  const_string file_33;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  const_string msg_19;
  const_string msg_20;
  const_string msg_21;
  const_string msg_22;
  const_string msg_23;
  const_string msg_24;
  const_string msg_25;
  const_string msg_26;
  const_string msg_27;
  const_string msg_28;
  const_string msg_29;
  const_string msg_30;
  const_string msg_31;
  const_string msg_32;
  const_string msg_33;
  check_type cVar11;
  char **ppcVar10;
  assertion_result *ar;
  assertion_result *ar_00;
  char *local_880;
  char *local_878;
  undefined1 *local_870;
  undefined1 *local_868;
  char *local_860;
  char *local_858;
  char *local_850;
  char *local_848;
  undefined1 *local_840;
  undefined1 *local_838;
  char *local_830;
  char *local_828;
  char *local_820;
  char *local_818;
  undefined1 *local_810;
  undefined1 *local_808;
  char *local_800;
  char *local_7f8;
  char *local_7f0;
  char *local_7e8;
  undefined1 *local_7e0;
  undefined1 *local_7d8;
  char *local_7d0;
  char *local_7c8;
  char *local_7c0;
  char *local_7b8;
  undefined1 *local_7b0;
  undefined1 *local_7a8;
  char *local_7a0;
  char *local_798;
  char *local_790;
  char *local_788;
  undefined1 *local_780;
  undefined1 *local_778;
  char *local_770;
  char *local_768;
  char *local_760;
  char *local_758;
  undefined1 *local_750;
  undefined1 *local_748;
  char *local_740;
  char *local_738;
  char *local_700;
  char *local_6f8;
  undefined1 *local_6f0;
  undefined1 *local_6e8;
  char *local_6e0;
  char *local_6d8;
  char *local_6d0;
  char *local_6c8;
  undefined1 *local_6c0;
  undefined1 *local_6b8;
  char *local_6b0;
  char *local_6a8;
  char *local_6a0;
  char *local_698;
  undefined1 *local_690;
  undefined1 *local_688;
  char *local_680;
  char *local_678;
  char *local_670;
  char *local_668;
  undefined1 *local_660;
  undefined1 *local_658;
  char *local_650;
  char *local_648;
  char *local_640;
  char *local_638;
  undefined1 *local_630;
  undefined1 *local_628;
  char *local_620;
  char *local_618;
  char *local_610;
  char *local_608;
  undefined1 *local_600;
  undefined1 *local_5f8;
  char *local_5f0;
  char *local_5e8;
  char *local_5e0;
  char *local_5d8;
  undefined1 *local_5d0;
  undefined1 *local_5c8;
  char *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  undefined1 *local_5a0;
  undefined1 *local_598;
  char *local_590;
  char *local_588;
  char *local_580;
  char *local_578;
  undefined1 *local_570;
  undefined1 *local_568;
  char *local_560;
  char *local_558;
  char *local_550;
  char *local_548;
  undefined1 *local_540;
  undefined1 *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  char *local_518;
  undefined1 *local_510;
  undefined1 *local_508;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  char *local_4e8;
  undefined1 *local_4e0;
  undefined1 *local_4d8;
  char *local_4d0;
  char *local_4c8;
  char *local_4c0;
  char *local_4b8;
  undefined1 *local_4b0;
  undefined1 *local_4a8;
  char *local_4a0;
  char *local_498;
  char *local_490;
  char *local_488;
  undefined1 *local_480;
  undefined1 *local_478;
  char *local_470;
  char *local_468;
  char *local_460;
  char *local_458;
  undefined1 *local_450;
  undefined1 *local_448;
  char *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  undefined1 *local_420;
  undefined1 *local_418;
  char *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  undefined1 *local_3f0;
  undefined1 *local_3e8;
  char *local_3e0;
  char *local_3d8;
  char *local_3a0;
  char *local_398;
  undefined1 *local_390;
  undefined1 *local_388;
  char *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  undefined1 *local_360;
  undefined1 *local_358;
  char *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  undefined1 *local_330;
  undefined1 *local_328;
  char *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  undefined1 *local_300;
  undefined1 *local_2f8;
  char *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  undefined1 *local_2d0;
  undefined1 *local_2c8;
  char *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  undefined1 *local_2a0;
  undefined1 *local_298;
  char *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  undefined1 *local_270;
  undefined1 *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  undefined1 *local_240;
  undefined1 *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  undefined1 *local_210;
  undefined1 *local_208;
  char *local_200;
  char *local_1f8;
  uint8_t i;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  undefined1 local_168 [16];
  undefined1 *local_158;
  char **local_150;
  char *local_148;
  char *local_140;
  char *local_138;
  char *local_130;
  BufferedFile bf;
  _Vector_base<std::byte,_std::allocator<std::byte>_> local_e8;
  AutoFile local_c8;
  uint8_t a [29];
  path local_88;
  path streams_test_filename;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ArgsManager::GetDataDirBase((path *)&local_88,&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).m_args);
  fs::operator/(&streams_test_filename,(path *)&local_88,"streams_test_tmp");
  std::filesystem::__cxx11::path::~path(&local_88);
  local_c8.m_file = (FILE *)fsbridge::fopen((char *)&streams_test_filename,"w+b");
  local_c8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.m_xor.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base(&local_e8);
  for (obj = '\0'; obj != '('; obj = obj + '\x01') {
    ser_writedata8<AutoFile>(&local_c8,obj);
  }
  rewind((FILE *)local_c8.m_file);
  BufferedFile::BufferedFile(&bf,&local_c8,0x19,0x19);
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_130 = "";
  local_148 = "";
  local_140 = "";
  file.m_end = (iterator)0x10e;
  file.m_begin = (iterator)&local_138;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
  a._0_8_ = a._0_8_ & 0xffffffffffffff00;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_150 = &local_178;
  local_178 = "false";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_180 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,_cVar11,(size_t)&local_188,
             0x10e);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  BufferedFile::BufferedFile(&bf,&local_c8,0x19,10);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x116;
  file_00.m_begin = (iterator)&local_1c8;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_1d8,
             msg_00);
  bVar2 = BufferedFile::eof(&bf);
  a[0] = !bVar2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_150 = &local_178;
  local_178 = "!bf.eof()";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1e0 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,_cVar11,(size_t)&local_1e8,
             0x116);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_200 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_1f8 = "";
  local_210 = &boost::unit_test::basic_cstring<char_const>::null;
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x11a;
  file_01.m_begin = (iterator)&local_200;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_210,
             msg_01);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_220 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_218 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_220,0x11a,1,2,puVar8,"i",(assertion_result *)a,"0");
  i = ser_readdata8<BufferedFile>(&bf);
  local_230 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_228 = "";
  local_240 = &boost::unit_test::basic_cstring<char_const>::null;
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x11c;
  file_02.m_begin = (iterator)&local_230;
  msg_02.m_end = (iterator)puVar8;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_240,
             msg_02);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_250 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_248 = "";
  a[0] = '\x01';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_250,0x11c,1,2,puVar8,"i",(assertion_result *)a,"1");
  local_260 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_258 = "";
  local_270 = &boost::unit_test::basic_cstring<char_const>::null;
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x11f;
  file_03.m_begin = (iterator)&local_260;
  msg_03.m_end = (iterator)puVar8;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_270,
             msg_03);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_280 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_278 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,2);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_280,0x11f,1,2,puVar8,"bf.GetPos()",ppcVar10,"2U");
  local_290 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_288 = "";
  local_2a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  file_04.m_end = (iterator)0x122;
  file_04.m_begin = (iterator)&local_290;
  msg_04.m_end = (iterator)puVar8;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_2a0,
             msg_04);
  uVar4 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (bf.nSrcPos >= uVar4) {
    bf.m_read_pos = bf.nSrcPos - uVar4;
  }
  ar = (assertion_result *)a;
  a[0] = bf.nSrcPos < uVar4 || bf.nSrcPos - uVar4 == 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(0)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_2b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2a8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,(size_t)&local_2b0,0x122);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_2c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2b8 = "";
  local_2d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_05.m_end = (iterator)0x124;
  file_05.m_begin = (iterator)&local_2c0;
  msg_05.m_end = pvVar7;
  msg_05.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_2d0,
             msg_05);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_2e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2d8 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_2e0,0x124,1,2,puVar8,"i",ar,"0");
  local_2f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_2e8 = "";
  local_300 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_06.m_end = (iterator)0x127;
  file_06.m_begin = (iterator)&local_2f0;
  msg_06.m_end = (iterator)puVar8;
  msg_06.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,(size_t)&local_300,
             msg_06);
  bf.m_read_pos = 2;
  if (1 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 2U;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  ar_00 = (assertion_result *)a;
  a[0] = bVar2 && 1 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(2)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_310 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_308 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (ar_00,(lazy_ostream *)local_168,1,0,WARN,(check_type)ar,(size_t)&local_310,0x127);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_320 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_318 = "";
  local_330 = &boost::unit_test::basic_cstring<char_const>::null;
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  file_07.m_end = (iterator)0x129;
  file_07.m_begin = (iterator)&local_320;
  msg_07.m_end = pvVar7;
  msg_07.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_330,
             msg_07);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_340 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_338 = "";
  a[0] = '\x02';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_340,0x129,1,2,puVar8,"i",ar_00,"2");
  local_350 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_348 = "";
  local_360 = &boost::unit_test::basic_cstring<char_const>::null;
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  file_08.m_end = (iterator)0x12f;
  file_08.m_begin = (iterator)&local_350;
  msg_08.m_end = (iterator)puVar8;
  msg_08.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_360,
             msg_08);
  if (bf.m_read_pos < 4) {
    bf.nReadLimit = 3;
  }
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetLimit(3)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_370 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_368 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  a[0] = bf.m_read_pos < 4;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ar_00,
             (size_t)&local_370,0x12f);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_380 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_378 = "";
  local_390 = &boost::unit_test::basic_cstring<char_const>::null;
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  file_09.m_end = (iterator)0x132;
  file_09.m_begin = (iterator)&local_380;
  msg_09.m_end = pvVar7;
  msg_09.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_390,
             msg_09);
  a[0] = '\0';
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "false";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_3a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_398 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ar_00,
             (size_t)&local_3a0,0x132);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_3e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3d8 = "";
  local_3f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_10.m_end = (iterator)0x138;
  file_10.m_begin = (iterator)&local_3e0;
  msg_10.m_end = pvVar7;
  msg_10.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_3f0,
             msg_10);
  bf.nReadLimit = 0xffffffffffffffff;
  a[0] = '\x01';
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetLimit()";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_400 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_3f8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ar_00,
             (size_t)&local_400,0x138);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_410 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_408 = "";
  local_420 = &boost::unit_test::basic_cstring<char_const>::null;
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  file_11.m_end = (iterator)0x13a;
  file_11.m_begin = (iterator)&local_410;
  msg_11.m_end = pvVar7;
  msg_11.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_420,
             msg_11);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_430 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_428 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,3);
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_430,0x13a,1,2,puVar8,"bf.GetPos()",&local_178,"3U");
  bVar3 = 3;
  while (a[0] = bVar3, bVar3 < 10) {
    i = ser_readdata8<BufferedFile>(&bf);
    local_440 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_438 = "";
    local_450 = &boost::unit_test::basic_cstring<char_const>::null;
    local_448 = &boost::unit_test::basic_cstring<char_const>::null;
    file_12.m_end = (iterator)0x13f;
    file_12.m_begin = (iterator)&local_440;
    msg_12.m_end = (iterator)puVar8;
    msg_12.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_450,
               msg_12);
    local_168[8] = false;
    local_168._0_8_ = &PTR__lazy_ostream_011480b0;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = (char **)0xc7f1cc;
    local_460 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_458 = "";
    pvVar6 = (iterator)0x2;
    puVar8 = &i;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,unsigned_char>
              (local_168,&local_460,0x13f,1,2,&i,"i",a,"j");
    bVar3 = a[0] + 1;
  }
  local_470 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_468 = "";
  local_480 = &boost::unit_test::basic_cstring<char_const>::null;
  local_478 = &boost::unit_test::basic_cstring<char_const>::null;
  file_13.m_end = (iterator)0x141;
  file_13.m_begin = (iterator)&local_470;
  msg_13.m_end = (iterator)puVar8;
  msg_13.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_480,
             msg_13);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_490 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_488 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,10);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_490,0x141,1,2,puVar8,"bf.GetPos()",ppcVar10,"10U");
  local_4a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_498 = "";
  local_4b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_14.m_end = (iterator)0x144;
  file_14.m_begin = (iterator)&local_4a0;
  msg_14.m_end = (iterator)puVar8;
  msg_14.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_4b0,
             msg_14);
  uVar4 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (bf.nSrcPos >= uVar4) {
    bf.m_read_pos = bf.nSrcPos - uVar4;
  }
  a[0] = bf.nSrcPos < uVar4 || bf.nSrcPos - uVar4 == 0;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(0)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_4c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4b8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_4c0,0x144);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_4d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4c8 = "";
  local_4e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_4d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_15.m_end = (iterator)0x145;
  file_15.m_begin = (iterator)&local_4d0;
  msg_15.m_end = pvVar7;
  msg_15.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_4e0,
             msg_15);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_4f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4e8 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)((ulong)local_178 & 0xffffffff00000000);
  pvVar6 = (iterator)0x2;
  puVar9 = puVar8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_4f0,0x145,1,2,puVar8,"bf.GetPos()",&local_178,"0U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_500 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_4f8 = "";
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  local_508 = &boost::unit_test::basic_cstring<char_const>::null;
  file_16.m_end = (iterator)0x147;
  file_16.m_begin = (iterator)&local_500;
  msg_16.m_end = (iterator)puVar9;
  msg_16.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_510,
             msg_16);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_520 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_518 = "";
  a._0_8_ = a._0_8_ & 0xffffffff00000000;
  pvVar6 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_520,0x147,1,2,puVar9,"i",puVar8,"0");
  local_530 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_528 = "";
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  local_538 = &boost::unit_test::basic_cstring<char_const>::null;
  file_17.m_end = (iterator)0x14c;
  file_17.m_begin = (iterator)&local_530;
  msg_17.m_end = (iterator)puVar9;
  msg_17.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_540,
             msg_17);
  bf.m_read_pos = 10;
  if (9 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 10U;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 9 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(10)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_550 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_548 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)puVar8,
             (size_t)&local_550,0x14c);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_560 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_558 = "";
  local_570 = &boost::unit_test::basic_cstring<char_const>::null;
  local_568 = &boost::unit_test::basic_cstring<char_const>::null;
  file_18.m_end = (iterator)0x14e;
  file_18.m_begin = (iterator)&local_560;
  msg_18.m_end = pvVar7;
  msg_18.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_570,
             msg_18);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_580 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_578 = "";
  a[0] = '\n';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_580,0x14e,1,2,puVar8,"i",(assertion_result *)a,"10");
  local_590 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_588 = "";
  local_5a0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  file_19.m_end = (iterator)0x14f;
  file_19.m_begin = (iterator)&local_590;
  msg_19.m_end = (iterator)puVar8;
  msg_19.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_19,(size_t)&local_5a0,
             msg_19);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_5b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5a8 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,0xb);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_5b0,0x14f,1,2,puVar8,"bf.GetPos()",ppcVar10,"11U");
  local_5c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5b8 = "";
  local_5d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_20.m_end = (iterator)0x153;
  file_20.m_begin = (iterator)&local_5c0;
  msg_20.m_end = (iterator)puVar8;
  msg_20.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_20,(size_t)&local_5d0,
             msg_20);
  uVar4 = ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 1;
  bf.m_read_pos = (ulong)(bf.nSrcPos != 0);
  if (uVar4 < bf.nSrcPos) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bf.nSrcPos - 1 < uVar4;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(1)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_5e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5d8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_5e0,0x153);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_5f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_5e8 = "";
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5f8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_21.m_end = (iterator)0x154;
  file_21.m_begin = (iterator)&local_5f0;
  msg_21.m_end = pvVar7;
  msg_21.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_21,(size_t)&local_600,
             msg_21);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_610 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_608 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,1);
  pvVar6 = (iterator)0x2;
  puVar9 = puVar8;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_610,0x154,1,2,puVar8,"bf.GetPos()",&local_178,"1U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_620 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_618 = "";
  local_630 = &boost::unit_test::basic_cstring<char_const>::null;
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  file_22.m_end = (iterator)0x156;
  file_22.m_begin = (iterator)&local_620;
  msg_22.m_end = (iterator)puVar9;
  msg_22.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_22,(size_t)&local_630,
             msg_22);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_640 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_638 = "";
  a[0] = '\x01';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar6 = (iterator)0x2;
  puVar9 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_640,0x156,1,2,puVar9,"i",puVar8,"1");
  local_650 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_648 = "";
  local_660 = &boost::unit_test::basic_cstring<char_const>::null;
  local_658 = &boost::unit_test::basic_cstring<char_const>::null;
  file_23.m_end = (iterator)0x15a;
  file_23.m_begin = (iterator)&local_650;
  msg_23.m_end = (iterator)puVar9;
  msg_23.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_23,(size_t)&local_660,
             msg_23);
  bf.m_read_pos = 0xb;
  if (10 >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0xbU;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 10 < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(11)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_670 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_668 = "";
  pvVar6 = &DAT_00000001;
  puVar9 = (uint8_t *)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)puVar8,
             (size_t)&local_670,0x15a);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  Unserialize<BufferedFile,_unsigned_char,_29>(&bf,&a);
  for (lVar5 = 0; lVar5 != 0x1d; lVar5 = lVar5 + 1) {
    local_680 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_678 = "";
    local_690 = &boost::unit_test::basic_cstring<char_const>::null;
    local_688 = &boost::unit_test::basic_cstring<char_const>::null;
    file_24.m_end = (iterator)0x15f;
    file_24.m_begin = (iterator)&local_680;
    msg_24.m_end = (iterator)puVar9;
    msg_24.m_begin = pvVar6;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file_24,(size_t)&local_690,
               msg_24);
    local_168[8] = false;
    local_168._0_8_ = &PTR__lazy_ostream_011480b0;
    local_158 = boost::unit_test::lazy_ostream::inst;
    local_150 = (char **)0xc7f1cc;
    local_6a0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp"
    ;
    local_698 = "";
    puVar9 = a + lVar5;
    local_178 = (char *)CONCAT44(local_178._4_4_,(int)lVar5 + 0xb);
    pvVar6 = (iterator)0x2;
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
              (local_168,&local_6a0,0x15f,1,2,puVar9,"a[j]",&local_178,"11 + j");
  }
  local_6b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6a8 = "";
  local_6c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6b8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_25.m_end = (iterator)0x162;
  file_25.m_begin = (iterator)&local_6b0;
  msg_25.m_end = (iterator)puVar9;
  msg_25.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_25,(size_t)&local_6c0,
             msg_25);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_6d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6c8 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,0x28);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_6d0,0x162,1,2,puVar8,"bf.GetPos()",ppcVar10,"40U");
  i = ser_readdata8<BufferedFile>(&bf);
  local_6e0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6d8 = "";
  local_6f0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_6e8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_26.m_end = (iterator)0x167;
  file_26.m_begin = (iterator)&local_6e0;
  msg_26.m_end = (iterator)puVar8;
  msg_26.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_26,(size_t)&local_6f0,
             msg_26);
  a._0_8_ = a._0_8_ & 0xffffffffffffff00;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "false";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_700 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_6f8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_700,0x167);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_740 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_738 = "";
  local_750 = &boost::unit_test::basic_cstring<char_const>::null;
  local_748 = &boost::unit_test::basic_cstring<char_const>::null;
  file_27.m_end = (iterator)0x16d;
  file_27.m_begin = (iterator)&local_740;
  msg_27.m_end = pvVar7;
  msg_27.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_27,(size_t)&local_750,
             msg_27);
  bVar2 = BufferedFile::eof(&bf);
  a[0] = bVar2;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.eof()";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_760 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_758 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_760,0x16d);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_770 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_768 = "";
  local_780 = &boost::unit_test::basic_cstring<char_const>::null;
  local_778 = &boost::unit_test::basic_cstring<char_const>::null;
  file_28.m_end = (iterator)0x170;
  file_28.m_begin = (iterator)&local_770;
  msg_28.m_end = pvVar7;
  msg_28.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_28,(size_t)&local_780,
             msg_28);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_790 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_788 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,0x28);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_790,0x170,1,2,puVar8,"bf.GetPos()",ppcVar10,"40U");
  local_7a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_798 = "";
  local_7b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7a8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_29.m_end = (iterator)0x171;
  file_29.m_begin = (iterator)&local_7a0;
  msg_29.m_end = (iterator)puVar8;
  msg_29.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_29,(size_t)&local_7b0,
             msg_29);
  bf.m_read_pos = 0x1e;
  if (0x1d >= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos;
  }
  bVar2 = bf.nSrcPos <=
          ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start) + 0x1eU;
  if (!bVar2) {
    bf.m_read_pos =
         bf.nSrcPos -
         ((long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
         (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
               super__Vector_impl_data._M_start);
  }
  a[0] = bVar2 && 0x1d < bf.nSrcPos;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.SetPos(30)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_7c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_7b8 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_7c0,0x171);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  i = ser_readdata8<BufferedFile>(&bf);
  local_7d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_7c8 = "";
  local_7e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_7d8 = &boost::unit_test::basic_cstring<char_const>::null;
  file_30.m_end = (iterator)0x173;
  file_30.m_begin = (iterator)&local_7d0;
  msg_30.m_end = pvVar7;
  msg_30.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_30,(size_t)&local_7e0,
             msg_30);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_7f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_7e8 = "";
  a[0] = '\x1e';
  a[1] = '\0';
  a[2] = '\0';
  a[3] = '\0';
  pvVar6 = (iterator)0x2;
  puVar8 = &i;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_char,int>
            (local_168,&local_7f0,0x173,1,2,puVar8,"i",(assertion_result *)a,"30");
  local_800 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_7f8 = "";
  local_810 = &boost::unit_test::basic_cstring<char_const>::null;
  local_808 = &boost::unit_test::basic_cstring<char_const>::null;
  file_31.m_end = (iterator)0x174;
  file_31.m_begin = (iterator)&local_800;
  msg_31.m_end = (iterator)puVar8;
  msg_31.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_31,(size_t)&local_810,
             msg_31);
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011480b0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = (char **)0xc7f1cc;
  local_820 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_818 = "";
  puVar8 = a;
  a[0] = (undefined1)bf.m_read_pos;
  a[1] = bf.m_read_pos._1_1_;
  a[2] = bf.m_read_pos._2_1_;
  a[3] = bf.m_read_pos._3_1_;
  a[4] = bf.m_read_pos._4_1_;
  a[5] = bf.m_read_pos._5_1_;
  a[6] = bf.m_read_pos._6_1_;
  a[7] = bf.m_read_pos._7_1_;
  local_178 = (char *)CONCAT44(local_178._4_4_,0x1f);
  ppcVar10 = &local_178;
  pvVar6 = (iterator)0x2;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
            (local_168,&local_820,0x174,1,2,puVar8,"bf.GetPos()",ppcVar10,"31U");
  local_830 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_828 = "";
  local_840 = &boost::unit_test::basic_cstring<char_const>::null;
  local_838 = &boost::unit_test::basic_cstring<char_const>::null;
  file_32.m_end = (iterator)0x177;
  file_32.m_begin = (iterator)&local_830;
  msg_32.m_end = (iterator)puVar8;
  msg_32.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_32,(size_t)&local_840,
             msg_32);
  uVar4 = (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>._M_impl.
                super__Vector_impl_data._M_start;
  bf.m_read_pos = 0;
  if (uVar4 <= bf.nSrcPos) {
    bf.m_read_pos = bf.nSrcPos - uVar4;
  }
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "!bf.SetPos(0)";
  local_170 = "";
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_850 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_848 = "";
  pvVar6 = &DAT_00000001;
  pvVar7 = (iterator)0x0;
  a[0] = uVar4 <= bf.nSrcPos && bf.nSrcPos - uVar4 != 0;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)local_168,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_850,0x177);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  local_860 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_858 = "";
  local_870 = &boost::unit_test::basic_cstring<char_const>::null;
  local_868 = &boost::unit_test::basic_cstring<char_const>::null;
  file_33.m_end = (iterator)0x17a;
  file_33.m_begin = (iterator)&local_860;
  msg_33.m_end = pvVar7;
  msg_33.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_33,(size_t)&local_870,
             msg_33);
  a[0] = bf.m_read_pos < 0x1f;
  a[8] = '\0';
  a[9] = '\0';
  a[10] = '\0';
  a[0xb] = '\0';
  a[0xc] = '\0';
  a[0xd] = '\0';
  a[0xe] = '\0';
  a[0xf] = '\0';
  a[0x10] = '\0';
  a[0x11] = '\0';
  a[0x12] = '\0';
  a[0x13] = '\0';
  a[0x14] = '\0';
  a[0x15] = '\0';
  a[0x16] = '\0';
  a[0x17] = '\0';
  local_178 = "bf.GetPos() <= 30U";
  local_170 = "";
  __stream = (FILE *)local_168;
  local_168[8] = false;
  local_168._0_8_ = &PTR__lazy_ostream_011481f0;
  local_158 = boost::unit_test::lazy_ostream::inst;
  local_150 = &local_178;
  local_880 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/streams_tests.cpp";
  local_878 = "";
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)a,(lazy_ostream *)__stream,1,0,WARN,(check_type)ppcVar10,
             (size_t)&local_880,0x17a);
  boost::detail::shared_count::~shared_count((shared_count *)(a + 0x10));
  AutoFile::fclose(&local_c8,__stream);
  std::filesystem::remove((path *)&streams_test_filename);
  std::_Vector_base<std::byte,_std::allocator<std::byte>_>::~_Vector_base
            (&bf.vchBuf.super__Vector_base<std::byte,_std::allocator<std::byte>_>);
  AutoFile::~AutoFile(&local_c8);
  std::filesystem::__cxx11::path::~path(&streams_test_filename.super_path);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(streams_buffered_file)
{
    fs::path streams_test_filename = m_args.GetDataDirBase() / "streams_test_tmp";
    AutoFile file{fsbridge::fopen(streams_test_filename, "w+b")};

    // The value at each offset is the offset.
    for (uint8_t j = 0; j < 40; ++j) {
        file << j;
    }
    std::rewind(file.Get());

    // The buffer size (second arg) must be greater than the rewind
    // amount (third arg).
    try {
        BufferedFile bfbad{file, 25, 25};
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "Rewind limit must be less than buffer size") != nullptr);
    }

    // The buffer is 25 bytes, allow rewinding 10 bytes.
    BufferedFile bf{file, 25, 10};
    BOOST_CHECK(!bf.eof());

    uint8_t i;
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // After reading bytes 0 and 1, we're positioned at 2.
    BOOST_CHECK_EQUAL(bf.GetPos(), 2U);

    // Rewind to offset 0, ok (within the 10 byte window).
    BOOST_CHECK(bf.SetPos(0));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can go forward to where we've been, but beyond may fail.
    BOOST_CHECK(bf.SetPos(2));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 2);

    // If you know the maximum number of bytes that should be
    // read to deserialize the variable, you can limit the read
    // extent. The current file offset is 3, so the following
    // SetLimit() allows zero bytes to be read.
    BOOST_CHECK(bf.SetLimit(3));
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                           "Attempt to position past buffer limit") != nullptr);
    }
    // The default argument removes the limit completely.
    BOOST_CHECK(bf.SetLimit());
    // The read position should still be at 3 (no change).
    BOOST_CHECK_EQUAL(bf.GetPos(), 3U);

    // Read from current offset, 3, forward until position 10.
    for (uint8_t j = 3; j < 10; ++j) {
        bf >> i;
        BOOST_CHECK_EQUAL(i, j);
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 10U);

    // We're guaranteed (just barely) to be able to rewind to zero.
    BOOST_CHECK(bf.SetPos(0));
    BOOST_CHECK_EQUAL(bf.GetPos(), 0U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 0);

    // We can set the position forward again up to the farthest
    // into the stream we've been, but no farther. (Attempting
    // to go farther may succeed, but it's not guaranteed.)
    BOOST_CHECK(bf.SetPos(10));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 10);
    BOOST_CHECK_EQUAL(bf.GetPos(), 11U);

    // Now it's only guaranteed that we can rewind to offset 1
    // (current read position, 11, minus rewind amount, 10).
    BOOST_CHECK(bf.SetPos(1));
    BOOST_CHECK_EQUAL(bf.GetPos(), 1U);
    bf >> i;
    BOOST_CHECK_EQUAL(i, 1);

    // We can stream into large variables, even larger than
    // the buffer size.
    BOOST_CHECK(bf.SetPos(11));
    {
        uint8_t a[40 - 11];
        bf >> a;
        for (uint8_t j = 0; j < sizeof(a); ++j) {
            BOOST_CHECK_EQUAL(a[j], 11 + j);
        }
    }
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);

    // We've read the entire file, the next read should throw.
    try {
        bf >> i;
        BOOST_CHECK(false);
    } catch (const std::exception& e) {
        BOOST_CHECK(strstr(e.what(),
                        "BufferedFile::Fill: end of file") != nullptr);
    }
    // Attempting to read beyond the end sets the EOF indicator.
    BOOST_CHECK(bf.eof());

    // Still at offset 40, we can go back 10, to 30.
    BOOST_CHECK_EQUAL(bf.GetPos(), 40U);
    BOOST_CHECK(bf.SetPos(30));
    bf >> i;
    BOOST_CHECK_EQUAL(i, 30);
    BOOST_CHECK_EQUAL(bf.GetPos(), 31U);

    // We're too far to rewind to position zero.
    BOOST_CHECK(!bf.SetPos(0));
    // But we should now be positioned at least as far back as allowed
    // by the rewind window (relative to our farthest read position, 40).
    BOOST_CHECK(bf.GetPos() <= 30U);

    // We can explicitly close the file, or the destructor will do it.
    file.fclose();

    fs::remove(streams_test_filename);
}